

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cfb.c
# Opt level: O0

void beltCFBStepD(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_cfb_st *st;
  ulong local_10;
  ulong *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0xc) != 0) {
    if (in_RSI <= *(ulong *)(in_RDX + 0xc)) {
      memXor2(in_RDI,(void *)((long)in_RDX + (0x30 - *(long *)(in_RDX + 0xc))),in_RSI);
      memXor2((void *)((long)in_RDX + (0x30 - *(long *)(in_RDX + 0xc))),in_RDI,in_RSI);
      *(ulong *)(in_RDX + 0xc) = *(long *)(in_RDX + 0xc) - in_RSI;
      return;
    }
    memXor2(in_RDI,(void *)((long)in_RDX + (0x30 - *(long *)(in_RDX + 0xc))),
            *(size_t *)(in_RDX + 0xc));
    memXor2((void *)((long)in_RDX + (0x30 - *(long *)(in_RDX + 0xc))),in_RDI,
            *(size_t *)(in_RDX + 0xc));
    local_10 = in_RSI - *(long *)(in_RDX + 0xc);
    local_8 = (ulong *)((long)in_RDI + *(long *)(in_RDX + 0xc));
    in_RDX[0xc] = 0;
    in_RDX[0xd] = 0;
  }
  for (; 0xf < local_10; local_10 = local_10 - 0x10) {
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    *local_8 = *(ulong *)(in_RDX + 8) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 10) ^ local_8[1];
    *(ulong *)(in_RDX + 8) = *local_8 ^ *(ulong *)(in_RDX + 8);
    *(ulong *)(in_RDX + 10) = local_8[1] ^ *(ulong *)(in_RDX + 10);
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    memXor2(local_8,in_RDX + 8,local_10);
    memXor2(in_RDX + 8,local_8,local_10);
    *(ulong *)(in_RDX + 0xc) = 0x10 - local_10;
  }
  return;
}

Assistant:

void beltCFBStepD(void* buf, size_t count, void* state)
{
	belt_cfb_st* st = (belt_cfb_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCFB_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block + 16 - st->reserved, count);
			memXor2(st->block + 16 - st->reserved, buf, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block + 16 - st->reserved, st->reserved);
		memXor2(st->block + 16 - st->reserved, buf, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockEncr(st->block, st->key);
		beltBlockXor2(buf, st->block);
		beltBlockXor2(st->block, buf);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockEncr(st->block, st->key);
		memXor2(buf, st->block, count);
		memXor2(st->block, buf, count);
		st->reserved = 16 - count;
	}
}